

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

bool __thiscall flatbuffers::Parser::Deserialize(Parser *this,uint8_t *buf,size_t size)

{
  bool bVar1;
  bool bVar2;
  char *identifier;
  code *pcVar3;
  ulong uVar4;
  Schema *local_a0;
  Schema *schema;
  _func_bool_Verifier_ptr *verify_fn;
  undefined1 local_70 [7];
  bool size_prefixed;
  Verifier verifier;
  size_t size_local;
  uint8_t *buf_local;
  Parser *this_local;
  
  verifier.flex_reuse_tracker_ = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)size;
  VerifierTemplate<false>::VerifierTemplate
            ((VerifierTemplate<false> *)local_70,buf,size,0x40,1000000,true);
  bVar2 = false;
  bVar1 = reflection::SchemaBufferHasIdentifier(buf);
  if (!bVar1) {
    identifier = reflection::SchemaIdentifier();
    bVar2 = BufferHasIdentifier(buf,identifier,true);
    if (!bVar2) {
      return false;
    }
    bVar2 = true;
  }
  pcVar3 = reflection::VerifySchemaBuffer;
  if (bVar2) {
    pcVar3 = reflection::VerifySizePrefixedSchemaBuffer;
  }
  uVar4 = (*pcVar3)(local_70);
  if ((uVar4 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    if (bVar2) {
      local_a0 = reflection::GetSizePrefixedSchema(buf);
    }
    else {
      local_a0 = reflection::GetSchema(buf);
    }
    this_local._7_1_ = Deserialize(this,local_a0);
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::Deserialize(const uint8_t *buf, const size_t size) {
  flatbuffers::Verifier verifier(reinterpret_cast<const uint8_t *>(buf), size);
  bool size_prefixed = false;
  if (!reflection::SchemaBufferHasIdentifier(buf)) {
    if (!flatbuffers::BufferHasIdentifier(buf, reflection::SchemaIdentifier(),
                                          true))
      return false;
    else
      size_prefixed = true;
  }
  auto verify_fn = size_prefixed ? &reflection::VerifySizePrefixedSchemaBuffer
                                 : &reflection::VerifySchemaBuffer;
  if (!verify_fn(verifier)) { return false; }
  auto schema = size_prefixed ? reflection::GetSizePrefixedSchema(buf)
                              : reflection::GetSchema(buf);
  return Deserialize(schema);
}